

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

int cs_impl::system_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  name_space *pnVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  undefined4 uVar5;
  allocator local_21c;
  allocator local_21b;
  allocator local_21a;
  allocator local_219;
  allocator local_218;
  allocator local_217;
  allocator local_216;
  allocator local_215;
  allocator local_214;
  allocator local_213;
  allocator local_212;
  allocator local_211;
  var local_210;
  var local_208;
  var local_200;
  var local_1f8;
  var local_1f0;
  var local_1e8;
  var local_1e0;
  var local_1d8;
  var local_1d0;
  var local_1c8;
  var local_1c0;
  var local_1b8;
  string local_1b0;
  string local_190;
  __allocator_type __a2;
  string local_150;
  __allocator_type __a2_1;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  console_cs_ext::init(ctx);
  file_cs_ext::init(ctx);
  path_cs_ext::init(ctx);
  pnVar2 = system_ext;
  std::__cxx11::string::string((string *)&local_50,"console",&local_211);
  cs::make_namespace((cs *)&local_1c8,(namespace_t *)&console_ext);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_50,&local_1c8);
  std::__cxx11::string::string((string *)&local_70,"file",&local_212);
  cs::make_namespace((cs *)&local_1d0,(namespace_t *)&file_ext);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_70,&local_1d0);
  std::__cxx11::string::string((string *)&local_90,"path",&local_213);
  cs::make_namespace((cs *)&local_1d8,(namespace_t *)&path_ext);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_90,&local_1d8);
  std::__cxx11::string::string((string *)&local_b0,"in",&local_214);
  uVar5 = 1;
  local_190._M_dataplus._M_p._0_4_ = 1;
  local_1b0._M_dataplus._M_p._0_4_ = uVar5;
  if ((any::holder<std::shared_ptr<std::istream>>::allocator._520_8_ == 0) ||
     (cs::global_thread_counter != 0)) {
    pcVar3 = (pointer)operator_new(0x18);
  }
  else {
    pcVar3 = *(pointer *)
              (&any::holder<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>::
                allocator + any::holder<std::shared_ptr<std::istream>>::allocator._520_8_ * 8);
    any::holder<std::shared_ptr<std::istream>>::allocator._520_8_ =
         any::holder<std::shared_ptr<std::istream>>::allocator._520_8_ + -1;
  }
  *(undefined ***)pcVar3 = &PTR__holder_002433c8;
  *(undefined8 **)(pcVar3 + 8) = &std::cin;
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  puVar4 = (undefined8 *)operator_new(0x18);
  local_150._M_dataplus._M_p = (pointer)&__a2;
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_base_00243e00;
  puVar4[2] = &std::cin;
  *(undefined8 **)(pcVar3 + 0x10) = puVar4;
  local_150._M_string_length = 0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_istream<char,_std::char_traits<char>_>_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1898:57),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_istream<char,_std::char_traits<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1898:57),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_150);
  local_150._M_dataplus._M_p = pcVar3;
  local_1b8.mDat =
       cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
       alloc<int,int,cs_impl::any::holder<std::shared_ptr<std::istream>>*>
                 ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider> *)
                  any::allocator,(int *)&local_190,(int *)&local_1b0,
                  (holder<std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_> **)
                  &local_150);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_b0,&local_1b8);
  std::__cxx11::string::string((string *)&local_150,"out",&local_215);
  ___a2 = uVar5;
  if ((any::holder<std::shared_ptr<std::ostream>>::allocator._520_8_ == 0) ||
     (cs::global_thread_counter != 0)) {
    local_1b0._M_dataplus._M_p._0_4_ = uVar5;
    pcVar3 = (pointer)operator_new(0x18);
  }
  else {
    pcVar3 = *(pointer *)
              (&any::holder<std::shared_ptr<std::istream>>::allocator +
              any::holder<std::shared_ptr<std::ostream>>::allocator._520_8_ * 8);
    any::holder<std::shared_ptr<std::ostream>>::allocator._520_8_ =
         any::holder<std::shared_ptr<std::ostream>>::allocator._520_8_ + -1;
    local_1b0._M_dataplus._M_p._0_4_ = uVar5;
  }
  *(undefined ***)pcVar3 = &PTR__holder_002434e0;
  *(undefined8 **)(pcVar3 + 8) = &std::cout;
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  puVar4 = (undefined8 *)operator_new(0x18);
  local_190._M_dataplus._M_p = (pointer)&__a2_1;
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_base_00243e60;
  puVar4[2] = &std::cout;
  *(undefined8 **)(pcVar3 + 0x10) = puVar4;
  local_190._M_string_length = 0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_ostream<char,_std::char_traits<char>_>_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1899:59),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_ostream<char,_std::char_traits<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1899:59),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_190);
  local_190._M_dataplus._M_p = pcVar3;
  local_1c0.mDat =
       cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
       alloc<int,int,cs_impl::any::holder<std::shared_ptr<std::ostream>>*>
                 ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider> *)
                  any::allocator,(int *)&local_1b0,(int *)&__a2,
                  (holder<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_> **)
                  &local_190);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_150,&local_1c0);
  std::__cxx11::string::string((string *)&local_190,"run",&local_216);
  cs::make_cni<cs::numeric(&)(std::__cxx11::string_const&)>((cs *)&local_1e0,run,false);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_190,&local_1e0);
  std::__cxx11::string::string((string *)&local_1b0,"getenv",&local_217);
  cs::make_cni<std::__cxx11::string(&)(std::__cxx11::string_const&)>((cs *)&local_1e8,getenv,false);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_1b0,&local_1e8);
  std::__cxx11::string::string((string *)&__a2,"exit",&local_218);
  cs::make_cni<void(&)(cs::numeric_const&)>((cs *)&local_1f0,exit,false);
  pnVar2 = cs::name_space::add_var(pnVar2,(string *)&__a2,&local_1f0);
  std::__cxx11::string::string((string *)&__a2_1,"is_platform_windows",&local_219);
  cs::make_cni<bool(&)()>((cs *)&local_1f8,platform::is_platform_win32,false);
  pnVar2 = cs::name_space::add_var(pnVar2,(string *)&__a2_1,&local_1f8);
  std::__cxx11::string::string((string *)&local_d0,"is_platform_linux",&local_21a);
  cs::make_cni<bool(&)()>((cs *)&local_200,platform::is_platform_linux,false);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_d0,&local_200);
  std::__cxx11::string::string((string *)&local_f0,"is_platform_darwin",&local_21b);
  cs::make_cni<bool(&)()>((cs *)&local_208,platform::is_platform_darwin,false);
  pnVar2 = cs::name_space::add_var(pnVar2,&local_f0,&local_208);
  std::__cxx11::string::string((string *)&local_110,"is_platform_unix",&local_21c);
  cs::make_cni<bool(&)()>((cs *)&local_210,platform::is_platform_unix,false);
  cs::name_space::add_var(pnVar2,&local_110,&local_210);
  any::recycle(&local_210);
  std::__cxx11::string::~string((string *)&local_110);
  any::recycle(&local_208);
  std::__cxx11::string::~string((string *)&local_f0);
  any::recycle(&local_200);
  std::__cxx11::string::~string((string *)&local_d0);
  any::recycle(&local_1f8);
  std::__cxx11::string::~string((string *)&__a2_1);
  any::recycle(&local_1f0);
  std::__cxx11::string::~string((string *)&__a2);
  any::recycle(&local_1e8);
  std::__cxx11::string::~string((string *)&local_1b0);
  any::recycle(&local_1e0);
  std::__cxx11::string::~string((string *)&local_190);
  any::recycle(&local_1c0);
  std::__cxx11::string::~string((string *)&local_150);
  any::recycle(&local_1b8);
  std::__cxx11::string::~string((string *)&local_b0);
  any::recycle(&local_1d8);
  std::__cxx11::string::~string((string *)&local_90);
  any::recycle(&local_1d0);
  std::__cxx11::string::~string((string *)&local_70);
  any::recycle(&local_1c8);
  iVar1 = std::__cxx11::string::~string((string *)&local_50);
  return iVar1;
}

Assistant:

void init()
		{
			console_cs_ext::init();
			file_cs_ext::init();
			path_cs_ext::init();
			(*system_ext)
			.add_var("console", make_namespace(console_ext))
			.add_var("file", make_namespace(file_ext))
			.add_var("path", make_namespace(path_ext))
			.add_var("in", var::make_protect<istream>(&std::cin, [](std::istream *) {}))
			.add_var("out", var::make_protect<ostream>(&std::cout, [](std::ostream *) {}))
			.add_var("run", make_cni(run))
			.add_var("getenv", make_cni(getenv))
			.add_var("exit", make_cni(exit))
			.add_var("is_platform_windows", make_cni(platform::is_platform_win32))
			.add_var("is_platform_linux", make_cni(platform::is_platform_linux))
			.add_var("is_platform_darwin", make_cni(platform::is_platform_darwin))
			.add_var("is_platform_unix", make_cni(platform::is_platform_unix));
		}